

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

int xmlC14NPrintNamespaces(xmlNsPtr ns,xmlC14NCtxPtr ctx)

{
  int iVar1;
  char *str;
  xmlOutputBufferPtr out;
  
  if (ns == (xmlNsPtr)0x0 || ctx == (xmlC14NCtxPtr)0x0) {
    xmlC14NErrParam("writing namespaces");
    iVar1 = 0;
  }
  else {
    out = ctx->buf;
    if (ns->prefix == (xmlChar *)0x0) {
      str = " xmlns=";
    }
    else {
      xmlOutputBufferWriteString(out," xmlns:");
      xmlOutputBufferWriteString(ctx->buf,(char *)ns->prefix);
      out = ctx->buf;
      str = "=";
    }
    xmlOutputBufferWriteString(out,str);
    if (ns->href == (xmlChar *)0x0) {
      xmlOutputBufferWriteString(ctx->buf,"\"\"");
    }
    else {
      xmlBufWriteQuotedString(ctx->buf->buffer,ns->href);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
xmlC14NPrintNamespaces(const xmlNsPtr ns, xmlC14NCtxPtr ctx)
{

    if ((ns == NULL) || (ctx == NULL)) {
        xmlC14NErrParam("writing namespaces");
        return 0;
    }

    if (ns->prefix != NULL) {
        xmlOutputBufferWriteString(ctx->buf, " xmlns:");
        xmlOutputBufferWriteString(ctx->buf, (const char *) ns->prefix);
        xmlOutputBufferWriteString(ctx->buf, "=");
    } else {
        xmlOutputBufferWriteString(ctx->buf, " xmlns=");
    }
    if(ns->href != NULL) {
	xmlBufWriteQuotedString(ctx->buf->buffer, ns->href);
    } else {
    	xmlOutputBufferWriteString(ctx->buf, "\"\"");
    }
    return (1);
}